

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O2

void DebugSetLogfile(char *filename)

{
  char cVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (filename != (char *)0x0) {
    cVar1 = *filename;
    if (((cVar1 == '/') || (cVar1 == '\\')) ||
       ((iVar2 = isalpha((int)cVar1), iVar2 != 0 && (filename[1] == ':')))) {
      std::__cxx11::string::assign((char *)&g_logfilename_abi_cxx11_);
    }
    else {
      GetLogRootDir_abi_cxx11_();
      std::operator+(&local_30,&local_50,filename);
      std::__cxx11::string::operator=((string *)&g_logfilename_abi_cxx11_,(string *)&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      std::__cxx11::string::~string((string *)&local_50);
    }
    g_debugOutputFlags._0_1_ = (byte)g_debugOutputFlags | 8;
    return;
  }
  g_debugOutputFlags._0_1_ = (byte)g_debugOutputFlags & 0xf7;
  g_logfilename_abi_cxx11_._M_string_length = 0;
  *g_logfilename_abi_cxx11_._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void DebugSetLogfile(const char *filename)
{
    if (filename) {
#ifdef WIN32
        g_log_mutex= CreateMutex(NULL, false, NULL);
#endif
        if (filename[0]=='\\' || filename[0]=='/' || (isalpha(filename[0]) && filename[1]==':'))
            g_logfilename= filename;
        else
            g_logfilename= GetLogRootDir() + filename;
        g_debugOutputFlags |= DBG_LOGFILE;
        //MessageBox(0, _T("opening log"), ToTString(g_logfilename).c_str(), 0);
    }
    else {
        //MessageBox(0, _T("closing log"), _T("debug"), 0);
        g_debugOutputFlags &= ~DBG_LOGFILE;
#ifdef WIN32
        if (g_log_mutex && WaitForSingleObject(g_log_mutex, INFINITE)==WAIT_OBJECT_0) {
            CloseHandle(g_log_mutex);
            g_log_mutex= NULL;
        }
#endif
        g_logfilename.clear();
    }
}